

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O1

void __thiscall dd::ProcessThreadImpl::ProcessThreadImpl(ProcessThreadImpl *this,char *thread_name)

{
  (this->super_ProcessThread).super_TaskQueueBase._vptr_TaskQueueBase =
       (_func_int **)&PTR_Delete_0012fb18;
  pthread_mutex_init((pthread_mutex_t *)&this->_lock,(pthread_mutexattr_t *)0x0);
  SequenceCheckerImpl::SequenceCheckerImpl((SequenceCheckerImpl *)&this->_thread_checker);
  Event::Event(&this->_wake_up);
  (this->_thread)._M_t.
  super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
  super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
  super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl = (PlatformThread *)0x0;
  (this->_modules).
  super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_modules;
  (this->_modules).
  super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_modules;
  (this->_modules).
  super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
  ._M_impl._M_node._M_size = 0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::_M_initialize_map
            ((_Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_> *)&this->_queue,0);
  (this->_delayed_tasks).c.
  super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_delayed_tasks).c.
  super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_delayed_tasks).c.
  super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_stop = false;
  this->_thread_name = thread_name;
  return;
}

Assistant:

ProcessThreadImpl::ProcessThreadImpl(const char* thread_name)
		: _stop(false), _thread_name(thread_name) {}